

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemImpl.cpp
# Opt level: O2

uint efsw::Platform::System::sleep(uint __seconds)

{
  uint uVar1;
  long lVar2;
  ulong uVar3;
  undefined4 in_register_0000003c;
  timeval tv;
  pthread_mutex_t mutex;
  pthread_cond_t condition;
  timespec local_90;
  timeval local_80;
  pthread_mutex_t local_70;
  pthread_cond_t local_48;
  
  uVar3 = *(long *)CONCAT44(in_register_0000003c,__seconds) * 1000;
  gettimeofday(&local_80,(__timezone_ptr_t)0x0);
  lVar2 = (uVar3 % 1000000 + local_80.tv_usec) * 1000;
  local_90.tv_nsec = lVar2 % 1000000000;
  local_90.tv_sec = lVar2 / 1000000000 + uVar3 / 1000000 + local_80.tv_sec;
  pthread_mutex_init(&local_70,(pthread_mutexattr_t *)0x0);
  pthread_cond_init(&local_48,(pthread_condattr_t *)0x0);
  pthread_mutex_lock(&local_70);
  pthread_cond_timedwait(&local_48,&local_70,&local_90);
  pthread_mutex_unlock(&local_70);
  uVar1 = pthread_cond_destroy(&local_48);
  return uVar1;
}

Assistant:

void System::sleep( const unsigned long& ms ) {
	// usleep( static_cast<unsigned long>( ms * 1000 ) );

	// usleep is not reliable enough (it might block the
	// whole process instead of just the current thread)
	// so we must use pthread_cond_timedwait instead

	// this implementation is inspired from Qt
	// and taken from SFML

	unsigned long long usecs = ms * 1000;

	// get the current time
	timeval tv;
	gettimeofday( &tv, NULL );

	// construct the time limit (current time + time to wait)
	timespec ti;
	ti.tv_nsec = ( tv.tv_usec + ( usecs % 1000000 ) ) * 1000;
	ti.tv_sec = tv.tv_sec + ( usecs / 1000000 ) + ( ti.tv_nsec / 1000000000 );
	ti.tv_nsec %= 1000000000;

	// create a mutex and thread condition
	pthread_mutex_t mutex;
	pthread_mutex_init( &mutex, 0 );
	pthread_cond_t condition;
	pthread_cond_init( &condition, 0 );

	// wait...
	pthread_mutex_lock( &mutex );
	pthread_cond_timedwait( &condition, &mutex, &ti );
	pthread_mutex_unlock( &mutex );

	// destroy the mutex and condition
	pthread_cond_destroy( &condition );
}